

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O1

Error asmjit::v1_14::VirtMem::protect(void *p,size_t size,MemoryFlags memoryFlags)

{
  MemoryFlags __prot;
  int iVar1;
  Error EVar2;
  int *piVar3;
  MemoryFlags MVar4;
  
  MVar4 = kAccessRW;
  if ((memoryFlags & kAccessWrite) == kNone) {
    MVar4 = memoryFlags & kAccessRead;
  }
  __prot = MVar4 | kAccessRX;
  if ((memoryFlags & kAccessExecute) == kNone) {
    __prot = MVar4;
  }
  iVar1 = mprotect(p,size,__prot);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    EVar2 = asmjitErrorFromErrno(*piVar3);
    return EVar2;
  }
  return 0;
}

Assistant:

Error protect(void* p, size_t size, MemoryFlags memoryFlags) noexcept {
  int protection = mmProtFromMemoryFlags(memoryFlags);
  if (mprotect(p, size, protection) == 0)
    return kErrorOk;

  return DebugUtils::errored(asmjitErrorFromErrno(errno));
}